

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

void fillMath(ElementType a,ElementType b,ElementType c,ElementType d,ElementType e,ElementType f,
             Storage3D *field,int64_t domain_size,int64_t domain_height)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  lVar2 = -halo_width;
  lVar1 = domain_size + halo_width;
  if (lVar1 != lVar2 && SBORROW8(lVar1,lVar2) == lVar1 + halo_width < 0) {
    dVar8 = 1.0 / (double)(domain_size + halo_width * 2);
    do {
      lVar3 = -halo_width;
      lVar1 = halo_width + domain_size;
      if (lVar1 != lVar3 && SBORROW8(lVar1,lVar3) == lVar1 + halo_width < 0) {
        dVar4 = (double)lVar2 * dVar8;
        do {
          if (0 < domain_height) {
            dVar5 = (double)lVar3 * dVar8;
            lVar1 = 0;
            do {
              dVar6 = cos(pi * (c * dVar4 + dVar5));
              dVar7 = sin(pi * d * (dVar5 + dVar4 * e));
              field->alignedPtr
              [field->offset +
               (field->strides)._M_elems[2] * lVar3 +
               (field->strides)._M_elems[1] * lVar2 + (field->strides)._M_elems[0] * lVar1] =
                   (double)lVar1 * 0.01 + ((dVar7 + dVar6 + b) * a) / f;
              lVar1 = lVar1 + 1;
            } while (domain_height != lVar1);
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < halo_width + domain_size);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < domain_size + halo_width);
  }
  return;
}

Assistant:

void fillMath(ElementType a, ElementType b, ElementType c, ElementType d,
              ElementType e, ElementType f, Storage3D &field, const int64_t domain_size, const int64_t domain_height) {
  ElementType dx = ElementType(1.0) / (ElementType) (domain_size + 2*halo_width);
  ElementType dy = ElementType(1.0) / (ElementType) (domain_size + 2*halo_width);

  for (int64_t j = -halo_width; j < domain_size + halo_width; j++) {
    for (int64_t i = -halo_width; i < domain_size + halo_width; i++) {
      ElementType x = dx * (ElementType) i;
      ElementType y = dy * (ElementType) j;
      for (int64_t k = 0; k < domain_height; k++) {
          field(i, j, k) = k*ElementType(10e-3) + a*(b + cos(pi*(x + c*y)) + sin(d*pi*(x + e*y)))/f;
      }
    }
  }
}